

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O1

void __thiscall
cmDebugger::cmDebuggerVariables::EnumerateSubVariablesIfAny
          (cmDebuggerVariables *this,array<dap::Variable> *toBeReturned)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pcVar3;
  pointer psVar4;
  array<dap::Variable> ret;
  undefined1 local_1a8 [96];
  _Alloc_hider local_148;
  char local_138 [16];
  integer local_128;
  undefined8 uStack_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  bool local_100;
  _Alloc_hider local_f8;
  char local_e8 [16];
  bool local_d8;
  optional<dap::boolean> local_d0;
  _Alloc_hider local_c8;
  char local_b8 [16];
  bool local_a8;
  bool local_a0;
  _Alloc_hider local_98;
  size_type sStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  _Alloc_hider local_70;
  char local_60 [16];
  integer local_50;
  vector<dap::Variable,_std::allocator<dap::Variable>_> local_48;
  
  local_48.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = (this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->SubVariables).
           super__Vector_base<std::shared_ptr<cmDebugger::cmDebuggerVariables>,_std::allocator<std::shared_ptr<cmDebugger::cmDebuggerVariables>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      local_1a8._24_8_ = 0;
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = 0;
      local_1a8._32_8_ = 0;
      local_1a8._80_8_ = 0;
      local_1a8._40_8_ = 0;
      local_1a8._48_8_ = 0;
      local_1a8._56_8_ = local_1a8 + 0x48;
      local_1a8._64_8_ = 0;
      local_1a8._72_8_ = 0;
      local_1a8._88_8_ = 0;
      peVar2 = (psVar4->
               super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_148._M_p = local_138;
      pcVar3 = (peVar2->Name)._M_dataplus._M_p;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar3,pcVar3 + (peVar2->Name)._M_string_length);
      local_128.val = 0;
      uStack_120._0_1_ = false;
      uStack_120._1_7_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_118,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(anonymous_namespace)::PrivatePropertyHint);
      local_100 = (bool)(anonymous_namespace)::PrivatePropertyHint[0x18];
      local_f8._M_p = local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,(anonymous_namespace)::PrivatePropertyHint._32_8_,
                 (anonymous_namespace)::PrivatePropertyHint._40_8_ +
                 (anonymous_namespace)::PrivatePropertyHint._32_8_);
      local_d8 = (bool)(anonymous_namespace)::PrivatePropertyHint[0x40];
      local_d0.val.val = (bool)(anonymous_namespace)::PrivatePropertyHint[0x48];
      local_d0.set = (bool)(anonymous_namespace)::PrivatePropertyHint[0x49];
      local_c8._M_p = local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,(anonymous_namespace)::PrivatePropertyHint._80_8_,
                 (anonymous_namespace)::PrivatePropertyHint._88_8_ +
                 (anonymous_namespace)::PrivatePropertyHint._80_8_);
      local_a8 = (bool)(anonymous_namespace)::PrivatePropertyHint[0x70];
      local_a0 = true;
      if (this->SupportsVariableType == true) {
        local_98._M_p = (pointer)&local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"collection","");
        local_78._0_1_ = true;
      }
      else {
        local_88._8_8_ = 0;
        local_98._M_p = (pointer)&local_88;
        sStack_90 = 0;
        local_88._M_allocated_capacity = 0;
        local_78._0_1_ = false;
        local_78._1_7_ = 0;
      }
      peVar2 = (psVar4->
               super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_70._M_p = local_60;
      pcVar3 = (peVar2->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (peVar2->Value)._M_string_length);
      local_50.val = ((psVar4->
                      super___shared_ptr<cmDebugger::cmDebuggerVariables,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->Id;
      std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
                (toBeReturned,(Variable *)local_1a8);
      dap::Variable::~Variable((Variable *)local_1a8);
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  std::vector<dap::Variable,_std::allocator<dap::Variable>_>::~vector(&local_48);
  return;
}

Assistant:

void cmDebuggerVariables::EnumerateSubVariablesIfAny(
  dap::array<dap::Variable>& toBeReturned) const
{
  dap::array<dap::Variable> ret;
  for (auto const& variables : SubVariables) {
    toBeReturned.emplace_back(dap::Variable{
      {},
      {},
      {},
      variables->GetName(),
      {},
      PrivatePropertyHint,
      SupportsVariableType ? "collection" : dap::optional<dap::string>(),
      variables->GetValue(),
      variables->GetId() });
  }
}